

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O1

string * mocker::anon_unknown_0::renameIdentifier(string *__return_storage_ptr__,string *ident)

{
  size_type sVar1;
  pointer pcVar2;
  size_type sVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = ident->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (ident->_M_dataplus)._M_p;
    sVar3 = 0;
    do {
      if (pcVar2[sVar3] == '#') {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string renameIdentifier(const std::string &ident) {
  std::string res;
  for (auto ch : ident) {
    if (ch == '#') {
      res += "__";
      continue;
    }
    res.push_back(ch);
  }
  return res;
}